

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::adaptive_huffman_data_model::update(adaptive_huffman_data_model *this)

{
  uint uVar1;
  void *pContext;
  unsigned_short *puVar2;
  uchar *puVar3;
  uint uVar4;
  uint max_cycle;
  uint uStack_1c;
  bool status;
  uint total_freq;
  uint max_code_size;
  void *pTables;
  adaptive_huffman_data_model *this_local;
  
  this->m_total_count = this->m_update_cycle + this->m_total_count;
  pTables = this;
  if (0x7fff < this->m_total_count) {
    rescale(this);
  }
  pContext = create_generate_huffman_codes_tables();
  uVar1 = this->m_total_syms;
  _total_freq = pContext;
  puVar2 = vector<unsigned_short>::operator[](&this->m_sym_freq,0);
  puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
  generate_huffman_codes(pContext,uVar1,puVar2,puVar3,&stack0xffffffffffffffe4,&max_cycle);
  if (0x10 < uStack_1c) {
    uVar1 = this->m_total_syms;
    puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
    prefix_coding::limit_max_code_size(uVar1,puVar3,0x10);
  }
  free_generate_huffman_codes_tables(_total_freq);
  if ((this->m_encoding & 1U) == 0) {
    uVar1 = this->m_total_syms;
    puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
    prefix_coding::generate_decoder_tables
              (uVar1,puVar3,this->m_pDecode_tables,(uint)this->m_decoder_table_bits);
  }
  else {
    uVar1 = this->m_total_syms;
    puVar3 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
    puVar2 = vector<unsigned_short>::operator[](&this->m_codes,0);
    prefix_coding::generate_codes(uVar1,puVar3,puVar2);
  }
  this->m_update_cycle = this->m_update_cycle * 5 >> 2;
  uVar4 = (this->m_total_syms + 6) * 8;
  if (uVar4 < this->m_update_cycle) {
    this->m_update_cycle = uVar4;
  }
  this->m_symbols_until_update = this->m_update_cycle;
  return;
}

Assistant:

void adaptive_huffman_data_model::update()
    {
        m_total_count += m_update_cycle;

        if (m_total_count >= 32768)
        {
            rescale();
        }

        void* pTables = create_generate_huffman_codes_tables();

        uint max_code_size, total_freq;
        bool status = generate_huffman_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
        CRNLIB_ASSERT(status);
        CRNLIB_ASSERT(total_freq == m_total_count);

        if (max_code_size > prefix_coding::cMaxExpectedCodeSize)
        {
            prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], prefix_coding::cMaxExpectedCodeSize);
        }

        free_generate_huffman_codes_tables(pTables);

        if (m_encoding)
        {
            status = prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]);
        }
        else
        {
            status = prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, m_decoder_table_bits);
        }

        CRNLIB_ASSERT(status);
        (void)status;

        m_update_cycle = (5 * m_update_cycle) >> 2;
        uint max_cycle = (m_total_syms + 6) << 3; // this was << 2 - which is ~12% slower but compresses around .5% better

        if (m_update_cycle > max_cycle)
        {
            m_update_cycle = max_cycle;
        }

        m_symbols_until_update = m_update_cycle;
    }